

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_helper.h
# Opt level: O3

ssize_t __thiscall
spdlog::details::file_helper::write(file_helper *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  size_t __n_00;
  pointer pcVar2;
  size_t sVar3;
  spdlog_ex *this_00;
  int *piVar4;
  undefined4 in_register_00000034;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  lVar1 = *(long *)(CONCAT44(in_register_00000034,__fd) + 0x250);
  __n_00 = *(size_t *)(lVar1 + 0x10);
  sVar3 = fwrite(*(void **)(lVar1 + 8),1,__n_00,(FILE *)this->_fd);
  if (sVar3 == __n_00) {
    return sVar3;
  }
  this_00 = (spdlog_ex *)__cxa_allocate_exception(0x28);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  pcVar2 = (this->_filename)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar2,pcVar2 + (this->_filename)._M_string_length);
  std::operator+(&local_40,"Failed writing to file ",&local_60);
  piVar4 = __errno_location();
  spdlog_ex::spdlog_ex(this_00,&local_40,*piVar4);
  __cxa_throw(this_00,&spdlog_ex::typeinfo,spdlog_ex::~spdlog_ex);
}

Assistant:

void write(const log_msg &msg)
    {
        size_t msg_size = msg.formatted.size();
        auto data = msg.formatted.data();
        if (std::fwrite(data, 1, msg_size, _fd) != msg_size)
        {
            throw spdlog_ex("Failed writing to file " + os::filename_to_str(_filename), errno);
        }
    }